

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsViewPrivate::mapRectFromScene(QGraphicsViewPrivate *this,QRectF *rect)

{
  undefined8 *in_RDX;
  QRectF *in_RSI;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsViewPrivate *dx;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dx = in_RDI;
  if ((*(uint *)&in_RSI[0x18].xp >> 5 & 1) != 0) {
    updateScroll(in_RDI);
  }
  if ((*(uint *)&in_RSI[0x18].xp >> 4 & 1) == 0) {
    QTransform::mapRect((QRectF *)&local_28);
  }
  else {
    local_28 = *in_RDX;
    local_20 = in_RDX[1];
    local_18 = in_RDX[2];
    local_10 = in_RDX[3];
  }
  QRectF::translated(in_RSI,(qreal)dx,(qreal)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QRectF *)dx;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsViewPrivate::mapRectFromScene(const QRectF &rect) const
{
    if (dirtyScroll)
        const_cast<QGraphicsViewPrivate *>(this)->updateScroll();
    return (identityMatrix ? rect : matrix.mapRect(rect)).translated(-scrollX, -scrollY);
}